

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ClassDeclarationSyntax::ClassDeclarationSyntax
          (ClassDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token virtualOrInterface,
          Token classKeyword,Token lifetime,Token name,ParameterPortListSyntax *parameters,
          ExtendsClauseSyntax *extendsClause,ImplementsClauseSyntax *implementsClause,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClass,
          NamedBlockClauseSyntax *endBlockName)

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = classKeyword._0_8_;
  uVar5 = virtualOrInterface._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClassDeclaration,attributes);
  (this->virtualOrInterface).kind = (short)uVar5;
  (this->virtualOrInterface).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->virtualOrInterface).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->virtualOrInterface).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->virtualOrInterface).info = virtualOrInterface.info;
  (this->classKeyword).kind = (short)uVar7;
  (this->classKeyword).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->classKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->classKeyword).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->classKeyword).info = classKeyword.info;
  (this->lifetime).kind = lifetime.kind;
  (this->lifetime).field_0x2 = lifetime._2_1_;
  (this->lifetime).numFlags = (NumericTokenFlags)lifetime.numFlags.raw;
  (this->lifetime).rawLen = lifetime.rawLen;
  (this->lifetime).info = lifetime.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  this->parameters = parameters;
  this->extendsClause = extendsClause;
  this->implementsClause = implementsClause;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  SVar3 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->endClass).kind = endClass.kind;
  (this->endClass).field_0x2 = endClass._2_1_;
  (this->endClass).numFlags = (NumericTokenFlags)endClass.numFlags.raw;
  (this->endClass).rawLen = endClass.rawLen;
  (this->endClass).info = endClass.info;
  this->endBlockName = endBlockName;
  if (parameters != (ParameterPortListSyntax *)0x0) {
    (parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (extendsClause != (ExtendsClauseSyntax *)0x0) {
    (extendsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (implementsClause != (ImplementsClauseSyntax *)0x0) {
    (implementsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar6) = this;
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClassDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token virtualOrInterface, Token classKeyword, Token lifetime, Token name, ParameterPortListSyntax* parameters, ExtendsClauseSyntax* extendsClause, ImplementsClauseSyntax* implementsClause, Token semi, const SyntaxList<MemberSyntax>& items, Token endClass, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClassDeclaration, attributes), virtualOrInterface(virtualOrInterface), classKeyword(classKeyword), lifetime(lifetime), name(name), parameters(parameters), extendsClause(extendsClause), implementsClause(implementsClause), semi(semi), items(items), endClass(endClass), endBlockName(endBlockName) {
        if (this->parameters) this->parameters->parent = this;
        if (this->extendsClause) this->extendsClause->parent = this;
        if (this->implementsClause) this->implementsClause->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }